

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O3

bool __thiscall RTIMUHal::HALOpen(RTIMUHal *this)

{
  uchar *this_00;
  int iVar1;
  uchar SPIBits;
  uchar SPIMode;
  uint32_t SPISpeed;
  char buf [32];
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  char local_48 [40];
  
  local_4d = 0;
  local_4e = 8;
  local_4c = this->m_SPISpeed;
  if (this->m_busIsI2C == true) {
    if (-1 < this->m_I2C) {
      return true;
    }
    if (this->m_I2CBus != 0xff) {
      sprintf(local_48,"/dev/i2c-%d");
      iVar1 = open(local_48,2);
      this->m_I2C = iVar1;
      if (-1 < iVar1) {
        return true;
      }
      fprintf(_stderr,"Failed to open I2C bus %d\n",(ulong)this->m_I2CBus);
      this->m_I2C = -1;
      return false;
    }
    HALOpen();
  }
  else if (this->m_SPIBus == 0xff) {
    HALOpen();
  }
  else {
    sprintf(local_48,"/dev/spidev%d.%d",(ulong)this->m_SPIBus,(ulong)this->m_SPISelect);
    iVar1 = open(local_48,2);
    this->m_SPI = iVar1;
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to open SPI bus %d, select %d\n",(ulong)this->m_SPIBus,
              (ulong)this->m_SPISelect);
      this->m_SPI = -1;
      return false;
    }
    this_00 = &this->m_SPIBus;
    iVar1 = ioctl(iVar1,0x40016b01,&local_4d);
    if (iVar1 < 0) {
      HALOpen((RTIMUHal *)this_00);
    }
    else {
      iVar1 = ioctl(this->m_SPI,0x80016b01,&local_4d);
      if (iVar1 < 0) {
        HALOpen((RTIMUHal *)this_00);
      }
      else {
        iVar1 = ioctl(this->m_SPI,0x40016b03,&local_4e);
        if (iVar1 < 0) {
          HALOpen((RTIMUHal *)this_00);
        }
        else {
          iVar1 = ioctl(this->m_SPI,0x80016b03,&local_4e);
          if (iVar1 < 0) {
            HALOpen((RTIMUHal *)this_00);
          }
          else {
            iVar1 = ioctl(this->m_SPI,0x40046b04,&local_4c);
            if (iVar1 < 0) {
              HALOpen();
            }
            else {
              iVar1 = ioctl(this->m_SPI,0x80046b04,&local_4c);
              if (-1 < iVar1) {
                return true;
              }
              HALOpen();
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUHal::HALOpen()
{
    char buf[32];
    unsigned char SPIMode = SPI_MODE_0;
    unsigned char SPIBits = 8;
    uint32_t SPISpeed = m_SPISpeed;

    if (m_busIsI2C) {
        if (m_I2C >= 0)
            return true;

        if (m_I2CBus == 255) {
            HAL_ERROR("No I2C bus has been set\n");
            return false;
        }
        sprintf(buf, "/dev/i2c-%d", m_I2CBus);
        m_I2C = open(buf, O_RDWR);
        if (m_I2C < 0) {
            HAL_ERROR1("Failed to open I2C bus %d\n", m_I2CBus);
            m_I2C = -1;
            return false;
        }
    } else {
        if (m_SPIBus == 255) {
            HAL_ERROR("No SPI bus has been set\n");
            return false;
        }

        sprintf(buf, "/dev/spidev%d.%d", m_SPIBus, m_SPISelect);
        m_SPI = open(buf, O_RDWR);
        if (m_SPI < 0) {
            HAL_ERROR2("Failed to open SPI bus %d, select %d\n", m_SPIBus, m_SPISelect);
            m_SPI = -1;
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set WR SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set RD SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set WR 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set RD 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set WR %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set RD %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }
    }
    return true;
}